

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateMetadataFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int iVar1;
  string *proto_file;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  string local_148;
  string local_128;
  int local_104;
  undefined1 local_100 [4];
  int lastindex;
  string fullname;
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> local_48;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  string filename;
  GeneratorContext *generator_context_local;
  bool is_descriptor_local;
  FileDescriptor *file_local;
  
  proto_file = FileDescriptor::name_abi_cxx11_(file);
  GeneratedMetadataFileName((string *)&output,proto_file,is_descriptor);
  iVar1 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,(string *)&output);
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
            (&local_48,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1));
  output_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get(&local_48);
  io::Printer::Printer((Printer *)((long)&fullname.field_2 + 8),output_00,'^');
  GenerateHead(file,(Printer *)((long)&fullname.field_2 + 8));
  FilenameToClassname((string *)local_100,(string *)&output);
  local_104 = std::__cxx11::string::find_last_of(local_100,0x5d00ab);
  std::__cxx11::string::substr((ulong)&local_128,(ulong)local_100);
  io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"namespace ^name^;\n\n","name",
                     &local_128);
  std::__cxx11::string::~string((string *)&local_128);
  if (local_104 == -1) {
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"class ^name^\n{\n","name",
                       (string *)local_100);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_148,(ulong)local_100);
    io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"class ^name^\n{\n","name",
                       &local_148);
    std::__cxx11::string::~string((string *)&local_148);
  }
  Indent((Printer *)((long)&fullname.field_2 + 8));
  GenerateAddFileToPool(file,is_descriptor,(Printer *)((long)&fullname.field_2 + 8));
  Outdent((Printer *)((long)&fullname.field_2 + 8));
  io::Printer::Print((Printer *)((long)&fullname.field_2 + 8),"}\n\n");
  std::__cxx11::string::~string((string *)local_100);
  io::Printer::~Printer((Printer *)((long)&fullname.field_2 + 8));
  internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr(&local_48);
  std::__cxx11::string::~string((string *)&output);
  return;
}

Assistant:

void GenerateMetadataFile(const FileDescriptor* file,
                          bool is_descriptor,
                          GeneratorContext* generator_context) {
  std::string filename = GeneratedMetadataFileName(file->name(), is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  printer.Print(
      "namespace ^name^;\n\n",
      "name", fullname.substr(0, lastindex));

  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  GenerateAddFileToPool(file, is_descriptor, &printer);

  Outdent(&printer);
  printer.Print("}\n\n");
}